

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O1

void __thiscall
TPZAnalysis::PostProcessErrorSerial
          (TPZAnalysis *this,TPZVec<double> *ervec,bool store_error,ostream *out)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  
  TPZCompMesh::EvaluateError(this->fCompMesh,store_error,ervec);
  uVar3 = (uint)ervec->fNElements;
  if ((int)uVar3 < 3) {
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"TPZAnalysis::PostProcess - At least 3 norms are expected.",0x39);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    cVar1 = (char)out;
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"############",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
        std::ostream::put(cVar1);
        poVar2 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"error ",6);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  = ",4);
        std::ostream::_M_insert<double>(ervec->fStore[uVar4]);
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar4);
    }
  }
  return;
}

Assistant:

void TPZAnalysis::PostProcessErrorSerial(TPZVec<REAL> &ervec, bool store_error, std::ostream &out ){

    fCompMesh->EvaluateError(store_error, ervec);


    const int nerrors = ervec.NElements();

    if (nerrors < 3) {
        PZError << endl << "TPZAnalysis::PostProcess - At least 3 norms are expected." << endl;
        out<<endl<<"############"<<endl;
        for(int ier = 0; ier < nerrors; ier++)
            out << endl << "error " << ier << "  = " << ervec[ier];
    }
    else {
#ifdef PZDEBUG
        out << "############" << endl;
        out << "Norma H1 or L2 -> p = " << ervec[0] << std::endl;
        out << "Norma L2 or L2 -> u = " << ervec[1] << std::endl;
        out << "Semi-norma H1 or L2 -> div = " << ervec[2] << std::endl;
        for (int ier = 3; ier < ervec.size(); ier++)
            out << "other norms = " << ervec[ier] << std::endl;
#endif
    }
}